

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link.cpp
# Opt level: O1

void __thiscall
rtosc::ThreadLink::writeArray(ThreadLink *this,char *dest,char *args,rtosc_arg_t *aargs)

{
  internal_ringbuffer_t *piVar1;
  size_t len;
  long lVar2;
  ulong uVar3;
  
  len = rtosc_amessage(this->write_buffer,this->MaxMsg,dest,args,aargs);
  piVar1 = this->ring;
  lVar2 = (piVar1->read).super___atomic_base<long>._M_i -
          (piVar1->write).super___atomic_base<long>._M_i;
  if (lVar2 == 0) {
    uVar3 = piVar1->size;
  }
  else {
    uVar3 = (lVar2 + piVar1->size) % piVar1->size;
  }
  if (uVar3 - 1 < len) {
    return;
  }
  ring_write(this->ring,this->write_buffer,len);
  return;
}

Assistant:

void ThreadLink::writeArray(const char *dest, const char *args, const rtosc_arg_t *aargs)
{
    const size_t len =
        rtosc_amessage(write_buffer, MaxMsg, dest, args, aargs);
    if(ring_write_size(ring) >= len)
        ring_write(ring,write_buffer,len);
}